

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_MinipointCounterTest_RoundWindPair_TestShell::createTest
          (TEST_MinipointCounterTest_RoundWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_RoundWindPair_Test *this_00;
  
  this_00 = (TEST_MinipointCounterTest_RoundWindPair_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                         ,0xd8);
  TEST_MinipointCounterTest_RoundWindPair_Test::TEST_MinipointCounterTest_RoundWindPair_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, RoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}